

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PolyMeshT.hh
# Opt level: O0

void __thiscall
OpenMesh::
PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
::calc_sector_normal
          (PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
           *this,HalfedgeHandle _in_heh,Normal *_sector_normal)

{
  Normal *_vec1;
  VectorT<double,_3> local_70;
  BaseHandle local_54;
  undefined1 local_50 [8];
  Normal vec1;
  Normal vec0;
  Normal *_sector_normal_local;
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  *this_local;
  HalfedgeHandle _in_heh_local;
  
  VectorT<double,_3>::VectorT((VectorT<double,_3> *)(vec1.super_VectorDataT<double,_3>.values_ + 2))
  ;
  VectorT<double,_3>::VectorT((VectorT<double,_3> *)local_50);
  _vec1 = (Normal *)local_50;
  local_54 = _in_heh.super_BaseHandle.idx_;
  calc_sector_vectors(this,_in_heh,(Normal *)(vec1.super_VectorDataT<double,_3>.values_ + 2),_vec1);
  cross<double,3>(&local_70,(OpenMesh *)(vec1.super_VectorDataT<double,_3>.values_ + 2),
                  (VectorT<double,_3> *)local_50,_vec1);
  (_sector_normal->super_VectorDataT<double,_3>).values_[0] =
       local_70.super_VectorDataT<double,_3>.values_[0];
  (_sector_normal->super_VectorDataT<double,_3>).values_[1] =
       local_70.super_VectorDataT<double,_3>.values_[1];
  (_sector_normal->super_VectorDataT<double,_3>).values_[2] =
       local_70.super_VectorDataT<double,_3>.values_[2];
  return;
}

Assistant:

void calc_sector_normal(HalfedgeHandle _in_heh, Normal& _sector_normal) const
  {
    Normal vec0, vec1;
    calc_sector_vectors(_in_heh, vec0, vec1);
    _sector_normal = cross(vec0, vec1);//(p2-p1)^(p0-p1)
  }